

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::Descriptor::ExtensionRange::CopyTo
          (ExtensionRange *this,DescriptorProto_ExtensionRange *proto)

{
  ExtensionRangeOptions *pEVar1;
  ExtensionRangeOptions *in_RDI;
  undefined8 in_stack_ffffffffffffffd8;
  int32 value;
  ExtensionRangeOptions *pEVar2;
  
  value = (int32)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  DescriptorProto_ExtensionRange::set_start((DescriptorProto_ExtensionRange *)in_RDI,value);
  DescriptorProto_ExtensionRange::set_end((DescriptorProto_ExtensionRange *)in_RDI,value);
  pEVar2 = (ExtensionRangeOptions *)
           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             *)&(in_RDI->_extensions_).arena_)->ptr_;
  pEVar1 = ExtensionRangeOptions::default_instance();
  if (pEVar2 != pEVar1) {
    pEVar2 = (ExtensionRangeOptions *)
             ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               *)&(in_RDI->_extensions_).arena_)->ptr_;
    DescriptorProto_ExtensionRange::mutable_options((DescriptorProto_ExtensionRange *)0x4ac1dd);
    ExtensionRangeOptions::operator=(in_RDI,pEVar2);
  }
  return;
}

Assistant:

void Descriptor::ExtensionRange::CopyTo(
    DescriptorProto_ExtensionRange* proto) const {
  proto->set_start(this->start);
  proto->set_end(this->end);
  if (options_ != &ExtensionRangeOptions::default_instance()) {
    *proto->mutable_options() = *options_;
  }
}